

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

void on_message_processing_completed_callback
               (MQ_MESSAGE_HANDLE message,MESSAGE_QUEUE_RESULT result,USER_DEFINED_REASON reason,
               void *message_context)

{
  LOGGER_LOG p_Var1;
  undefined4 local_40;
  undefined4 local_3c;
  AMQP_MESSENGER_REASON messenger_send_reason;
  AMQP_MESSENGER_SEND_RESULT messenger_send_result;
  MESSAGE_SEND_CONTEXT *msg_ctx;
  LOGGER_LOG l;
  void *message_context_local;
  USER_DEFINED_REASON reason_local;
  MESSAGE_QUEUE_RESULT result_local;
  MQ_MESSAGE_HANDLE message_local;
  
  if (message_context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"on_message_processing_completed_callback",0x38f,1,
                "on_message_processing_completed_callback invoked with NULL context");
    }
  }
  else {
    if (result == MESSAGE_QUEUE_SUCCESS) {
      local_3c = 0;
      local_40 = 0;
      *(undefined8 *)(*(long *)((long)message_context + 0x10) + 0x68) = 0;
    }
    else if (result == MESSAGE_QUEUE_TIMEOUT) {
      local_3c = 1;
      local_40 = 3;
      *(long *)(*(long *)((long)message_context + 0x10) + 0x68) =
           *(long *)(*(long *)((long)message_context + 0x10) + 0x68) + 1;
    }
    else if ((result == MESSAGE_QUEUE_CANCELLED) &&
            (*(int *)(*(long *)((long)message_context + 0x10) + 0x28) == 3)) {
      local_3c = 2;
      local_40 = 4;
      *(undefined8 *)(*(long *)((long)message_context + 0x10) + 0x68) = 0;
    }
    else {
      local_3c = 1;
      local_40 = 2;
      *(long *)(*(long *)((long)message_context + 0x10) + 0x68) =
           *(long *)(*(long *)((long)message_context + 0x10) + 0x68) + 1;
    }
    if (*(long *)((long)message_context + 0x18) != 0) {
      (**(code **)((long)message_context + 0x18))
                (local_3c,local_40,*(undefined8 *)((long)message_context + 0x20));
    }
    message_destroy((MESSAGE_HANDLE)message);
    destroy_message_send_context((MESSAGE_SEND_CONTEXT *)message_context);
  }
  return;
}

Assistant:

static void on_message_processing_completed_callback(MQ_MESSAGE_HANDLE message, MESSAGE_QUEUE_RESULT result, USER_DEFINED_REASON reason, void* message_context)
{
    (void)reason;

    if (message_context == NULL)
    {
        LogError("on_message_processing_completed_callback invoked with NULL context");
    }
    else
    {
        MESSAGE_SEND_CONTEXT* msg_ctx = (MESSAGE_SEND_CONTEXT*)message_context;
        AMQP_MESSENGER_SEND_RESULT messenger_send_result;
        AMQP_MESSENGER_REASON messenger_send_reason;

        if (result == MESSAGE_QUEUE_SUCCESS)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_SUCCESS;
            messenger_send_reason = AMQP_MESSENGER_REASON_NONE;

            msg_ctx->messenger->send_error_count = 0;
        }
        else if (result == MESSAGE_QUEUE_TIMEOUT)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_ERROR;
            messenger_send_reason = AMQP_MESSENGER_REASON_TIMEOUT;

            msg_ctx->messenger->send_error_count++;
        }
        else if (result == MESSAGE_QUEUE_CANCELLED && msg_ctx->messenger->state == AMQP_MESSENGER_STATE_STOPPED)
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_CANCELLED;
            messenger_send_reason = AMQP_MESSENGER_REASON_MESSENGER_DESTROYED;

            msg_ctx->messenger->send_error_count = 0;
        }
        else
        {
            messenger_send_result = AMQP_MESSENGER_SEND_RESULT_ERROR;
            messenger_send_reason = AMQP_MESSENGER_REASON_FAIL_SENDING;

            msg_ctx->messenger->send_error_count++;
        }

        if (msg_ctx->on_send_complete_callback != NULL)
        {
            msg_ctx->on_send_complete_callback(messenger_send_result, messenger_send_reason, msg_ctx->user_context);
        }

        message_destroy((MESSAGE_HANDLE)message);
        destroy_message_send_context(msg_ctx);
    }
}